

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineFiller.cc
# Opt level: O3

vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
* __thiscall
LineFiller::fill_all_paths
          (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           *__return_storage_ptr__,LineFiller *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *lines)

{
  LineFiller *this_00;
  long lVar1;
  void *pvVar2;
  long lVar3;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *pvVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  pointer pvVar8;
  ulong uVar9;
  value_type line;
  vector<long,_std::allocator<long>_> local_88;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *local_70;
  LineFiller *local_68;
  vector<long,_std::allocator<long>_> local_60;
  vector<long,_std::allocator<long>_> local_48;
  
  this_00 = this + 0x10;
  local_70 = __return_storage_ptr__;
  local_68 = this;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)this_00,
           ((long)(lines->
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(lines->
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar8 = (lines->
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((lines->
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar8) {
    lVar7 = 0;
    uVar9 = 0;
    do {
      std::vector<long,_std::allocator<long>_>::vector
                (&local_60,
                 (vector<long,_std::allocator<long>_> *)
                 ((long)&(pvVar8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar7));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Processing line ",0x10);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::vector<long,_std::allocator<long>_>::vector(&local_48,&local_60);
      line_fill(&local_88,local_68,&local_48);
      lVar1 = *(long *)this_00;
      pvVar2 = *(void **)(lVar1 + lVar7);
      lVar3 = *(long *)(lVar1 + 0x10 + lVar7);
      *(undefined8 *)(lVar1 + lVar7) =
           local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
      ((undefined8 *)(lVar1 + lVar7))[1] =
           local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      *(pointer *)(lVar1 + 0x10 + lVar7) =
           local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,lVar3 - (long)pvVar2);
        if (local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar9 = uVar9 + 1;
      pvVar8 = (lines->
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(lines->
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
              -0x5555555555555555;
      lVar7 = lVar7 + 0x18;
    } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
  }
  pvVar4 = local_70;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(local_70,(vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)this_00);
  return pvVar4;
}

Assistant:

std::vector<std::vector<sgNodeID_t >> LineFiller::fill_all_paths(std::vector<std::vector<sgNodeID_t >> lines){

    final_lines.resize(lines.size());
    auto total_ready = 0;
#pragma omp parallel for
    for (auto l=0; l<lines.size(); ++l){
        auto line = lines[l];
        std::cout << "Processing line " << total_ready << "/" << lines.size() <<std::endl;
        final_lines[l] = line_fill(line);
        total_ready++;
    }
    return final_lines;
}